

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction_common.h
# Opt level: O0

void __thiscall cfd::core::AbstractTxOut::AbstractTxOut(AbstractTxOut *this,AbstractTxOut *param_1)

{
  undefined7 uVar1;
  AbstractTxOut *param_1_local;
  AbstractTxOut *this_local;
  
  this->_vptr_AbstractTxOut = (_func_int **)&PTR__AbstractTxOut_009f7fe0;
  (this->value_).amount_ = (param_1->value_).amount_;
  uVar1 = *(undefined7 *)&(param_1->value_).field_0x9;
  (this->value_).ignore_check_ = (param_1->value_).ignore_check_;
  *(undefined7 *)&(this->value_).field_0x9 = uVar1;
  Script::Script(&this->locking_script_,&param_1->locking_script_);
  return;
}

Assistant:

class CFD_CORE_EXPORT AbstractTxOut {
 public:
  /**
   * @brief constructor
   */
  AbstractTxOut();
  /**
   * @brief constructor
   * @param[in] value             amount value.
   * @param[in] locking_script    locking script.
   */
  AbstractTxOut(const Amount& value, const Script& locking_script);
  /**
   * @brief constructor
   * @param[in] locking_script    locking script.
   */
  explicit AbstractTxOut(const Script& locking_script);
  /**
   * @brief destructor
   */
  virtual ~AbstractTxOut() {
    // do nothing
  }
  /**
   * @brief Get the amount.
   * @return amount
   */
  const Amount GetValue() const;
  /**
   * @brief Get the locking script.
   * @return locking script
   */
  const Script GetLockingScript() const;
  /**
   * @brief get value amount.
   * @param[in] value    amount.
   */
  virtual void SetValue(const Amount& value);

 protected:
  Amount value_;           ///< amount
  Script locking_script_;  ///< locking script
}